

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::IsPrepassSrcValueInfoPrecise
          (GlobOpt *this,Opnd *src,Value *srcValue,bool *isSafeToTransferInPrepass)

{
  Sym *pSVar1;
  ValueInfo *srcValueInfo;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  if (this->prePassLoop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1634,"(IsLoopPrePass())","IsLoopPrePass()");
    if (!bVar3) goto LAB_00454f54;
    *puVar6 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1635,"(src)","src");
    if (!bVar3) goto LAB_00454f54;
    *puVar6 = 0;
  }
  if (isSafeToTransferInPrepass != (bool *)0x0) {
    *isSafeToTransferInPrepass = false;
  }
  OVar4 = IR::Opnd::GetKind(src);
  if ((((OVar4 == OpndKindAddr) && (pSVar1 = srcValue->valueInfo->symStore, pSVar1 != (Sym *)0x0))
      && (pSVar1->m_kind == SymKindStack)) && (((ulong)pSVar1[1]._vptr_Sym & 0x40000) != 0)) {
    bVar3 = true;
    if (isSafeToTransferInPrepass != (bool *)0x0) {
      *isSafeToTransferInPrepass = false;
    }
  }
  else {
    OVar4 = IR::Opnd::GetKind(src);
    bVar3 = false;
    if ((srcValue != (Value *)0x0) && (bVar3 = false, OVar4 == OpndKindReg)) {
      srcValueInfo = srcValue->valueInfo;
      bVar3 = ValueType::IsDefinite(&srcValueInfo->super_ValueType);
      OVar4 = IR::Opnd::GetKind(src);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00454f54:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      bVar5 = IsSafeToTransferInPrepass(this,(StackSym *)src[1]._vptr_Opnd,srcValueInfo);
      if (isSafeToTransferInPrepass != (bool *)0x0) {
        *isSafeToTransferInPrepass = bVar5;
      }
      bVar3 = bVar3 && bVar5;
    }
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::IsPrepassSrcValueInfoPrecise(IR::Opnd *const src, Value *const srcValue, bool * isSafeToTransferInPrepass) const
{
    Assert(IsLoopPrePass());
    Assert(src);

    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = false;
    }

    if (src->IsAddrOpnd() &&
        srcValue->GetValueInfo()->GetSymStore() &&
        srcValue->GetValueInfo()->GetSymStore()->IsStackSym() &&
        srcValue->GetValueInfo()->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        if (isSafeToTransferInPrepass)
        {
            *isSafeToTransferInPrepass = false;
        }
        return true;
    }

    if (!src->IsRegOpnd() || !srcValue)
    {
        return false;
    }

    ValueInfo *const srcValueInfo = srcValue->GetValueInfo();
    bool isValueInfoDefinite = srcValueInfo->IsDefinite();

    StackSym * srcSym = src->AsRegOpnd()->m_sym;

    bool isSafeToTransfer = IsSafeToTransferInPrepass(srcSym, srcValueInfo);
    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = isSafeToTransfer;
    }

    return isValueInfoDefinite && isSafeToTransfer;
}